

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall
QColorDialogPrivate::setCurrentColor
          (QColorDialogPrivate *this,QColor *color,SetColorMode setColorMode)

{
  QColorShower *this_00;
  QRgb rgb;
  int i;
  QPlatformDialogHelper *pQVar1;
  
  if ((this->super_QDialogPrivate).nativeDialogInUse == true) {
    pQVar1 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
    (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,color);
    return;
  }
  if ((setColorMode & ShowColor) != 0) {
    rgb = QColor::rgb();
    setCurrentRgbColor(this,rgb);
    i = QColor::alpha();
    this_00 = this->cs;
    QtPrivate::QColSpinBox::setValue(this_00->alphaEd,i);
    QtPrivate::QColorShower::rgbEd(this_00);
  }
  if ((setColorMode & SelectColor) == 0) {
    return;
  }
  selectColor(this,color);
  return;
}

Assistant:

void QColorDialogPrivate::setCurrentColor(const QColor &color,  SetColorMode setColorMode)
{
    if (nativeDialogInUse) {
        platformColorDialogHelper()->setCurrentColor(color);
        return;
    }

    if (setColorMode & ShowColor) {
        setCurrentRgbColor(color.rgb());
        setCurrentAlpha(color.alpha());
    }
    if (setColorMode & SelectColor)
        selectColor(color);
}